

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Matrix<double> * __thiscall nnad::Matrix<double>::Inverse(Matrix<double> *this)

{
  int *in_RSI;
  Matrix<double> *in_RDI;
  int *i_00;
  int j;
  int i;
  Matrix<double> adj;
  double det;
  Matrix<double> *output;
  allocator<char> *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int iVar1;
  undefined4 in_stack_ffffffffffffff5c;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  int *in_stack_ffffffffffffff68;
  Matrix<double> *in_stack_ffffffffffffff70;
  allocator<char> local_79;
  string local_78 [8];
  int *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  Matrix<double> *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  uint in_stack_ffffffffffffffb8;
  uint uVar4;
  undefined4 in_stack_ffffffffffffffbc;
  Matrix<double> *in_stack_ffffffffffffffc8;
  string local_30 [48];
  
  if (*in_RSI != in_RSI[1]) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50);
    Error((string *)0x1034d6);
    std::__cxx11::string::~string(local_30);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffcf);
  }
  uVar4 = in_stack_ffffffffffffffb8 & 0xffffff;
  uVar3 = 0xffffffff;
  Matrix(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(int *)in_stack_ffffffffffffff60,
         (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  i_00 = (int *)Determinant((Matrix<double> *)CONCAT44(in_stack_ffffffffffffffbc,uVar4));
  if (((double)i_00 == 0.0) && (!NAN((double)i_00))) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff60,
               (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50);
    Error((string *)0x1035dc);
    std::__cxx11::string::~string(local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  Adjoint(in_stack_ffffffffffffffc8);
  for (iVar2 = 0; iVar2 < *in_RSI; iVar2 = iVar2 + 1) {
    for (iVar1 = 0; iVar1 < in_RSI[1]; iVar1 = iVar1 + 1) {
      GetElement(in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98,
                 in_stack_ffffffffffffff90);
      SetElement((Matrix<double> *)CONCAT44(uVar3,in_stack_ffffffffffffffb0),i_00,
                 &in_stack_ffffffffffffffa0->_Lines,in_stack_ffffffffffffff98);
    }
  }
  uVar4 = 0x1000000;
  ~Matrix((Matrix<double> *)0x103731);
  if ((uVar4 & 0x1000000) == 0) {
    ~Matrix((Matrix<double> *)0x103745);
  }
  return in_RDI;
}

Assistant:

Matrix<T> Inverse()
    {
      if (_Lines != _Columns)
        Error("inverse: matrix must be square.");

      Matrix<T> output{_Lines, _Columns};

      // Find Determinant
      T det = this->Determinant();
      if (det == 0)
        Error("inverse: Singular matrix, can't find its inverse");

      // Find Adjoint
      Matrix<T> adj = this->Adjoint();

      // Find Inverse using formula "inverse = adj/det"
      for (int i = 0; i < _Lines; i++)
        for (int j = 0; j < _Columns; j++)
          output.SetElement(i,j, adj.GetElement(i,j) / T{det});

      return output;
    }